

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

string_t __thiscall
duckdb::SHA256Operator::Operation<duckdb::string_t,duckdb::string_t>
          (SHA256Operator *this,string_t input,Vector *result)

{
  ulong uVar1;
  long lVar2;
  char *out;
  SHA256State state;
  string_t hash;
  SHA256State SStack_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  long local_38;
  string local_30;
  
  local_38 = input.value._0_8_;
  local_40 = this;
  local_50 = (undefined1  [16])
             StringVector::EmptyString(input.value._8_8_,(Vector *)0x40,(idx_t)input.value._8_8_);
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::SHA256State(&SStack_58);
  lVar2 = local_38;
  if (((ulong)local_40 & 0xffffffff) < 0xd) {
    lVar2 = (long)&local_40 + 4;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,lVar2,((ulong)local_40 & 0xffffffff) + lVar2);
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::AddString(&SStack_58,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  out = local_50 + 4;
  if (0xc < (uint)local_50._0_4_) {
    out = (char *)local_50._8_8_;
  }
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::FinishHex(&SStack_58,out);
  uVar1 = (ulong)(uint)local_50._0_4_;
  if (uVar1 < 0xd) {
    switchD_005700f1::default(local_50 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_50._4_4_ = *(undefined4 *)local_50._8_8_;
  }
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::~SHA256State(&SStack_58);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_50;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto hash = StringVector::EmptyString(result, duckdb_mbedtls::MbedTlsWrapper::SHA256_HASH_LENGTH_TEXT);

		duckdb_mbedtls::MbedTlsWrapper::SHA256State state;
		state.AddString(input.GetString());
		state.FinishHex(hash.GetDataWriteable());

		hash.Finalize();
		return hash;
	}